

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O2

void Gli_ManSimulateSeqPref(Gli_Man_t *p,int nPref)

{
  uint uVar1;
  uint uVar2;
  Gli_Obj_t *pGVar3;
  Gli_Obj_t *pGVar4;
  uint *puVar5;
  Gli_Man_t *p_00;
  ulong uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  
  iVar7 = 0;
  p_00 = p;
  while ((iVar7 < p->vCis->nSize - p->nRegs &&
         (p_00 = p, pGVar3 = Gli_ManCi(p,iVar7), pGVar3 != (Gli_Obj_t *)0x0))) {
    p_00 = (Gli_Man_t *)0x0;
    uVar1 = Gia_ManRandom(0);
    pGVar3->uSimInfo = uVar1;
    iVar7 = iVar7 + 1;
  }
  iVar7 = 0;
  while ((iVar7 < p->nRegs &&
         (p_00 = p, pGVar3 = Gli_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar7),
         pGVar3 != (Gli_Obj_t *)0x0))) {
    pGVar3->uSimInfo = 0;
    iVar7 = iVar7 + 1;
  }
  iVar7 = 0;
  if (nPref < 1) {
    nPref = iVar7;
  }
  for (; iVar7 != nPref; iVar7 = iVar7 + 1) {
    iVar8 = p->nObjData;
    uVar6 = 0;
    while (((int)uVar6 < iVar8 && (p->pObjData != (int *)0x0))) {
      pGVar3 = (Gli_Obj_t *)(p->pObjData + uVar6);
      uVar1 = *(uint *)pGVar3;
      if ((uVar1 & 1) == 0) {
        uVar2 = Gli_ManSimulateSeqNode(p_00,pGVar3);
        pGVar3->uSimInfo = uVar2;
      }
      uVar6 = (ulong)((int)uVar6 + (uVar1 >> 7) + (uVar1 >> 4 & 7) + 8);
    }
    iVar8 = 0;
    while ((iVar8 < p->nRegs &&
           (p_00 = p, pGVar3 = Gli_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar8),
           pGVar3 != (Gli_Obj_t *)0x0))) {
      pGVar3->uSimInfo = *(uint *)((long)pGVar3 + (long)*(int *)&pGVar3->field_0x1c * -4 + 0x10);
      iVar8 = iVar8 + 1;
    }
    iVar8 = 0;
    while ((iVar8 < p->vCis->nSize - p->nRegs &&
           (p_00 = p, pGVar3 = Gli_ManCi(p,iVar8), pGVar3 != (Gli_Obj_t *)0x0))) {
      p_00 = (Gli_Man_t *)0x0;
      uVar1 = Gia_ManRandom(0);
      pGVar3->uSimInfo = uVar1;
      iVar8 = iVar8 + 1;
    }
    iVar8 = 0;
    while (((iVar8 < p->nRegs &&
            (p_00 = p, pGVar3 = Gli_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar8),
            pGVar3 != (Gli_Obj_t *)0x0)) &&
           (p_00 = p, pGVar4 = Gli_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar8),
           pGVar4 != (Gli_Obj_t *)0x0))) {
      pGVar4->uSimInfo = pGVar3->uSimInfo;
      iVar8 = iVar8 + 1;
    }
  }
  if (p->pSimInfoPrev == (uint *)0x0) {
    puVar5 = (uint *)malloc((long)p->vCis->nSize << 2);
    p->pSimInfoPrev = puVar5;
  }
  lVar9 = 0;
  while( true ) {
    if (p->vCis->nSize <= lVar9) {
      return;
    }
    iVar7 = Vec_IntEntry(p->vCis,(int)lVar9);
    if (p->pObjData == (int *)0x0) break;
    p->pSimInfoPrev[lVar9] = p->pObjData[(long)iVar7 + 4];
    lVar9 = lVar9 + 1;
  }
  return;
}

Assistant:

void Gli_ManSimulateSeqPref( Gli_Man_t * p, int nPref )
{
    Gli_Obj_t * pObj, * pObjRi, * pObjRo;
    int i, f;
    // initialize simulation data
    Gli_ManForEachPi( p, pObj, i )
        pObj->uSimInfo = Gli_ManUpdateRandomInput( pObj->uSimInfo, 0.5 );
    Gli_ManForEachRo( p, pObj, i )
        pObj->uSimInfo = 0;
    for ( f = 0; f < nPref; f++ )
    {
        // simulate one frame
        Gli_ManForEachNode( p, pObj, i )
            pObj->uSimInfo = Gli_ManSimulateSeqNode( p, pObj );
        Gli_ManForEachRi( p, pObj, i )
            pObj->uSimInfo = Gli_ObjFanin(pObj, 0)->uSimInfo;
        // initialize the next frame
        Gli_ManForEachPi( p, pObj, i )
            pObj->uSimInfo = Gli_ManUpdateRandomInput( pObj->uSimInfo, 0.5 );
        Gli_ManForEachRiRo( p, pObjRi, pObjRo, i )
            pObjRo->uSimInfo = pObjRi->uSimInfo;
    }
    // save simulation data after nPref timeframes
    if ( p->pSimInfoPrev == NULL )
        p->pSimInfoPrev = ABC_ALLOC( unsigned, Gli_ManCiNum(p) );
    Gli_ManForEachCi( p, pObj, i )
        p->pSimInfoPrev[i] = pObj->uSimInfo;
}